

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdevice.cpp
# Opt level: O3

void QInputDevicePrivate::unregisterDevice(QInputDevice *dev)

{
  QBasicMutex QVar1;
  QDebug this;
  Type *c;
  QLoggingCategory *pQVar2;
  QBasicMutex *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QDebug local_50;
  QInputDevice local_48;
  QInputDevice *local_38;
  QArrayData *local_30 [3];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (-2 < (char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>::guard._q_value.
                 super___atomic_base<signed_char>._M_i) {
    if ((AtomicType)devicesMutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
      LOCK();
      devicesMutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
      UNLOCK();
    }
    else {
      in_RDI = &devicesMutex;
      QBasicMutex::lockInternal();
    }
    c = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_>::operator()
                  ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_>
                    *)in_RDI);
    QtPrivate::sequential_erase_one<QList<QInputDevice_const*>,QInputDevice_const*>(c,&local_38);
    pQVar2 = QtPrivateLogging::lcQpaInputDevices();
    if (((pQVar2->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
      QMessageLogger::info();
      this.stream = local_50.stream;
      QVar3.m_data = &DAT_0000000c;
      QVar3.m_size = (qsizetype)local_30;
      QString::fromUtf8(QVar3);
      QTextStream::operator<<(&(this.stream)->ts,(QString *)local_30);
      if (local_30[0] != (QArrayData *)0x0) {
        LOCK();
        (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_30[0],2,0x10);
        }
      }
      if ((local_50.stream)->space == true) {
        QTextStream::operator<<(&(local_50.stream)->ts,' ');
      }
      (local_50.stream)->ref = (local_50.stream)->ref + 1;
      ::operator<<((QDebug)&local_48.field_0x8,&local_48);
      QDebug::~QDebug((QDebug *)&local_48.field_0x8);
      QDebug::~QDebug((QDebug *)&local_48);
      QDebug::~QDebug(&local_50);
    }
    QVar1.d_ptr._q_value._M_b._M_p = devicesMutex.d_ptr._q_value._M_b._M_p;
    LOCK();
    devicesMutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
    UNLOCK();
    if ((AtomicType)QVar1.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
      QBasicMutex::unlockInternalFutex(&devicesMutex);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QInputDevicePrivate::unregisterDevice(const QInputDevice *dev)
{
    if (deviceList.isDestroyed())
        return;     // nothing to remove!

    QMutexLocker lock(&devicesMutex);
    deviceList()->removeOne(dev);
    qCInfo(lcQpaInputDevices) << "Unregistered" << dev;
}